

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiAgentDecisionProcessDiscrete.cpp
# Opt level: O2

OGet * __thiscall
MultiAgentDecisionProcessDiscrete::GetOGet(MultiAgentDecisionProcessDiscrete *this)

{
  bool bVar1;
  bool bVar2;
  ObservationModelMappingSparse *om;
  OGet_ObservationModelMappingSparse *this_00;
  
  bVar1 = this->_m_sparse;
  bVar2 = this->_m_eventObservability;
  this_00 = (OGet_ObservationModelMappingSparse *)operator_new(0x20);
  om = (ObservationModelMappingSparse *)this->_m_p_oModel;
  if (bVar2 == false) {
    if (bVar1 == false) {
      OGet_ObservationModelMapping::OGet_ObservationModelMapping
                ((OGet_ObservationModelMapping *)this_00,(ObservationModelMapping *)om);
    }
    else {
      OGet_ObservationModelMappingSparse::OGet_ObservationModelMappingSparse(this_00,om);
    }
  }
  else if (bVar1 == false) {
    OGet_EventObservationModelMapping::OGet_EventObservationModelMapping
              ((OGet_EventObservationModelMapping *)this_00,(EventObservationModelMapping *)om);
  }
  else {
    OGet_EventObservationModelMappingSparse::OGet_EventObservationModelMappingSparse
              ((OGet_EventObservationModelMappingSparse *)this_00,
               (EventObservationModelMappingSparse *)om);
  }
  return &this_00->super_OGet;
}

Assistant:

OGet* MultiAgentDecisionProcessDiscrete::GetOGet() const
{ 
    if(!_m_eventObservability) //default
    {
        if(_m_sparse)
            return new OGet_ObservationModelMappingSparse(
                    ((ObservationModelMappingSparse*)_m_p_oModel)  ); 
        else
            return new OGet_ObservationModelMapping(
                    ((ObservationModelMapping*)_m_p_oModel)  );
    }
    else
    {
        if(_m_sparse)
            return new OGet_EventObservationModelMappingSparse(
                    ((EventObservationModelMappingSparse*)_m_p_oModel)  ); 
        else
            return new OGet_EventObservationModelMapping(
                    ((EventObservationModelMapping*)_m_p_oModel)  );
    }    
}